

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsing.cpp
# Opt level: O3

Name __thiscall wasm::UniqueNameMapper::sourceToUnique(UniqueNameMapper *this,Name sName)

{
  map<wasm::Name,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>_>
  *this_00;
  iterator iVar1;
  mapped_type *pmVar2;
  string *psVar3;
  pointer pNVar4;
  char *pcVar5;
  Name NVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_38 [8];
  Name sName_local;
  
  sName_local.super_IString.str._M_len = sName.super_IString.str._M_str;
  local_38 = sName.super_IString.str._M_len;
  pNVar4 = (pointer)&DELEGATE_CALLER_TARGET;
  pcVar5 = DAT_010b25a8;
  if (DAT_010b25a8 != (char *)sName_local.super_IString.str._M_len) {
    this_00 = &this->labelMappings;
    iVar1 = std::
            _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>_>
            ::find(&this_00->_M_t,(key_type *)local_38);
    if ((_Rb_tree_header *)iVar1._M_node ==
        &(this->labelMappings)._M_t._M_impl.super__Rb_tree_header) {
      psVar3 = (string *)__cxa_allocate_exception(0x30);
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,sName_local.super_IString.str._M_len,
                 (long)local_38 + sName_local.super_IString.str._M_len);
      std::operator+(&local_98,"bad label in sourceToUnique: ",&local_58);
      *(string **)psVar3 = psVar3 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                (psVar3,local_98._M_dataplus._M_p,
                 local_98._M_dataplus._M_p + local_98._M_string_length);
      *(undefined4 *)(psVar3 + 0x20) = 0xffffffff;
      *(undefined4 *)(psVar3 + 0x24) = 0xffffffff;
      *(undefined4 *)(psVar3 + 0x28) = 0xffffffff;
      *(undefined4 *)(psVar3 + 0x2c) = 0xffffffff;
      __cxa_throw(psVar3,&ParseException::typeinfo,ParseException::~ParseException);
    }
    pmVar2 = std::
             map<wasm::Name,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>_>
             ::operator[](this_00,(key_type *)local_38);
    if ((pmVar2->super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>)._M_impl.
        super__Vector_impl_data._M_start ==
        (pmVar2->super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>)._M_impl.
        super__Vector_impl_data._M_finish) {
      psVar3 = (string *)__cxa_allocate_exception(0x30);
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,sName_local.super_IString.str._M_len,
                 (long)local_38 + sName_local.super_IString.str._M_len);
      std::operator+(&local_78,"use of popped label in sourceToUnique: ",&local_58);
      *(string **)psVar3 = psVar3 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                (psVar3,local_78._M_dataplus._M_p,
                 local_78._M_dataplus._M_p + local_78._M_string_length);
      *(undefined4 *)(psVar3 + 0x20) = 0xffffffff;
      *(undefined4 *)(psVar3 + 0x24) = 0xffffffff;
      *(undefined4 *)(psVar3 + 0x28) = 0xffffffff;
      *(undefined4 *)(psVar3 + 0x2c) = 0xffffffff;
      __cxa_throw(psVar3,&ParseException::typeinfo,ParseException::~ParseException);
    }
    pmVar2 = std::
             map<wasm::Name,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_>_>
             ::operator[](this_00,(key_type *)local_38);
    pNVar4 = (pmVar2->super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    pcVar5 = pNVar4[-1].super_IString.str._M_str;
    pNVar4 = pNVar4 + -1;
  }
  NVar6.super_IString.str._M_str = pcVar5;
  NVar6.super_IString.str._M_len = (pNVar4->super_IString).str._M_len;
  return (Name)NVar6.super_IString.str;
}

Assistant:

Name UniqueNameMapper::sourceToUnique(Name sName) {
  // DELEGATE_CALLER_TARGET is a fake target used to denote delegating to the
  // caller. We do not need to modify it, as it has no definitions, only uses.
  if (sName == DELEGATE_CALLER_TARGET) {
    return DELEGATE_CALLER_TARGET;
  }
  if (labelMappings.find(sName) == labelMappings.end()) {
    throw ParseException("bad label in sourceToUnique: " + sName.toString());
  }
  if (labelMappings[sName].empty()) {
    throw ParseException("use of popped label in sourceToUnique: " +
                         sName.toString());
  }
  return labelMappings[sName].back();
}